

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_common.c
# Opt level: O0

lysp_restr * lysp_node_musts(lysp_node *node)

{
  lysp_restr **pplVar1;
  lysp_restr **musts;
  lysp_node *node_local;
  
  pplVar1 = lysp_node_musts_p(node);
  if (pplVar1 == (lysp_restr **)0x0) {
    node_local = (lysp_node *)0x0;
  }
  else {
    node_local = (lysp_node *)*pplVar1;
  }
  return (lysp_restr *)node_local;
}

Assistant:

struct lysp_restr *
lysp_node_musts(const struct lysp_node *node)
{
    struct lysp_restr **musts;

    musts = lysp_node_musts_p(node);
    if (musts) {
        return *musts;
    } else {
        return NULL;
    }
}